

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.c
# Opt level: O0

deUint32 deRandom_getUint32(deRandom *rnd)

{
  uint uVar1;
  uint uVar2;
  deUint32 t;
  deUint32 w;
  deRandom *rnd_local;
  
  uVar2 = rnd->w;
  uVar1 = rnd->x ^ rnd->x << 0xb;
  rnd->x = rnd->y;
  rnd->y = rnd->z;
  rnd->z = uVar2;
  uVar2 = uVar2 ^ uVar2 >> 0x13 ^ uVar1 ^ uVar1 >> 8;
  rnd->w = uVar2;
  return uVar2;
}

Assistant:

deUint32 deRandom_getUint32 (deRandom* rnd)
{
	deUint32 w = rnd->w;
	deUint32 t;

	t = rnd->x ^ (rnd->x << 11);
	rnd->x = rnd->y;
	rnd->y = rnd->z;
	rnd->z = w;
	rnd->w = w = (w ^ (w >> 19)) ^ (t ^ (t >> 8));
	return w;
}